

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_LinetypeSegment>::Append
          (ON_SimpleArray<ON_LinetypeSegment> *this,ON_LinetypeSegment *x)

{
  eSegType eVar1;
  uint uVar2;
  ON_LinetypeSegment *pOVar3;
  ON_LinetypeSegment *pOVar4;
  uint uVar5;
  
  uVar2 = this->m_count;
  pOVar3 = x;
  if (uVar2 == this->m_capacity) {
    if ((int)uVar2 < 8 || (ulong)((long)(int)uVar2 * 0x10) < 0x10000001) {
      uVar5 = 4;
      if (2 < (int)uVar2) {
        uVar5 = uVar2 * 2;
      }
    }
    else {
      uVar5 = 0x1000008;
      if (uVar2 < 0x1000008) {
        uVar5 = uVar2;
      }
      uVar5 = uVar5 + uVar2;
    }
    if (x < this->m_a + (int)uVar2 && this->m_a <= x) {
      pOVar3 = (ON_LinetypeSegment *)onmalloc(0x10);
      eVar1 = x->m_seg_type;
      uVar2 = x->m_reserved2;
      pOVar3->m_length = x->m_length;
      pOVar3->m_seg_type = eVar1;
      pOVar3->m_reserved2 = uVar2;
      uVar2 = this->m_capacity;
    }
    if (uVar2 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    pOVar4 = this->m_a;
    if (pOVar4 == (ON_LinetypeSegment *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar2 = this->m_count;
  }
  else {
    pOVar4 = this->m_a;
  }
  this->m_count = uVar2 + 1;
  eVar1 = pOVar3->m_seg_type;
  uVar5 = pOVar3->m_reserved2;
  pOVar4 = pOVar4 + (int)uVar2;
  pOVar4->m_length = pOVar3->m_length;
  pOVar4->m_seg_type = eVar1;
  pOVar4->m_reserved2 = uVar5;
  if (pOVar3 == x) {
    return;
  }
  onfree(pOVar3);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}